

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funcargscontext_p.h
# Opt level: O2

void __thiscall
asmjit::v1_14::FuncArgsContext::WorkData::unassign(WorkData *this,uint32_t varId,uint32_t regId)

{
  bool bVar1;
  
  bVar1 = isAssigned(this,regId);
  if (!bVar1) {
    DebugUtils::assertionFailed
              ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
               ,0x91,"isAssigned(regId)");
  }
  if (this->_physToVarId[regId] == varId) {
    this->_physToVarId[regId] = 0xff;
    this->_assignedRegs = this->_assignedRegs ^ 1 << ((byte)regId & 0x1f);
    return;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_c_cmakelists/asmjit[P]asmjit/src/asmjit/core/../core/funcargscontext_p.h"
             ,0x92,"_physToVarId[regId] == varId");
}

Assistant:

inline void unassign(uint32_t varId, uint32_t regId) noexcept {
      ASMJIT_ASSERT(isAssigned(regId));
      ASMJIT_ASSERT(_physToVarId[regId] == varId);

      DebugUtils::unused(varId);
      _physToVarId[regId] = uint8_t(kVarIdNone);
      _assignedRegs ^= Support::bitMask(regId);
    }